

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

string * __thiscall
VectorInstance::op_replaceFirst_with
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *value;
  size_type *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  pointer psVar6;
  string *type;
  shared_ptr<Instance> instance;
  shared_ptr<Instance> temporary;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x40) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  value = &this->_element_type;
  get_shared_instance((string *)local_68,value);
  type = (string *)(local_68 + 0x10);
  get_shared_instance(type,value);
  psVar6 = (this->_value).
           super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->_value).
                              super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6) >> 4)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      bVar2 = InstanceIsEqualToComparator::operator()
                        ((InstanceIsEqualToComparator *)type,
                         (shared_ptr<Instance> *)
                         ((long)&(psVar6->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr + lVar5),(shared_ptr<Instance> *)local_68);
      if (bVar2) {
        get_shared_instance((string *)&local_48,value);
        psVar6 = (this->_value).
                 super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(psVar6->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi + lVar5);
        psVar1 = (size_type *)
                 ((long)&(psVar6->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                 lVar5);
        *psVar1 = local_48._M_allocated_capacity;
        psVar1[1] = local_48._8_8_;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        break;
      }
      lVar4 = lVar4 + 1;
      psVar6 = (this->_value).
               super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < (int)((ulong)((long)(this->_value).
                                         super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6)
                          >> 4));
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._24_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VectorInstance::op_replaceFirst_with(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    std::shared_ptr<Instance> temporary = get_shared_instance(_element_type, arguments[1]);
    for (int i = 0; i < int(_value.size()); i++)
        if (InstanceIsEqualToComparator()(_value[i], instance)) {
            _value[i] = get_shared_instance(_element_type, arguments[1]);
            break;
        }
    return "null";
}